

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Orphan<capnp::DynamicStruct> * __thiscall
capnp::Orphanage::newOrphan
          (Orphan<capnp::DynamicStruct> *__return_storage_ptr__,Orphanage *this,StructSchema schema)

{
  BuilderArena *arena;
  CapTableBuilder *capTable;
  StructSize size;
  OrphanBuilder local_48;
  Schema local_28;
  Orphanage *local_20;
  Orphanage *this_local;
  StructSchema schema_local;
  
  arena = this->arena;
  capTable = this->capTable;
  local_28 = schema.super_Schema.raw;
  local_20 = this;
  this_local = (Orphanage *)schema.super_Schema.raw;
  schema_local.super_Schema.raw = (Schema)(Schema)__return_storage_ptr__;
  size = anon_unknown_70::structSizeFromSchema(schema);
  capnp::_::OrphanBuilder::initStruct(&local_48,arena,capTable,size);
  Orphan<capnp::DynamicStruct>::Orphan(__return_storage_ptr__,(StructSchema)local_28.raw,&local_48);
  capnp::_::OrphanBuilder::~OrphanBuilder(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicStruct> Orphanage::newOrphan(StructSchema schema) const {
  return Orphan<DynamicStruct>(
      schema, _::OrphanBuilder::initStruct(arena, capTable, structSizeFromSchema(schema)));
}